

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O1

int readwbmp(_func_int_void_ptr *getin,void *in,Wbmp **return_wbmp)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Wbmp *ptr;
  int *piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  ptr = (Wbmp *)gdMalloc(0x18);
  if (ptr != (Wbmp *)0x0) {
    iVar1 = (*getin)(in);
    ptr->type = iVar1;
    if (iVar1 == 0) {
      do {
        uVar2 = (*getin)(in);
      } while ((uVar2 & 0x80000080) == 0x80);
      if (-1 < (int)uVar2) {
        uVar2 = 0;
        do {
          uVar3 = (*getin)(in);
          if ((int)uVar3 < 0) {
            uVar2 = 0xffffffff;
            break;
          }
          uVar2 = uVar2 << 7 | uVar3 & 0x7f;
        } while ((char)uVar3 < '\0');
        ptr->width = uVar2;
        if (uVar2 != 0xffffffff) {
          uVar2 = 0;
          do {
            uVar3 = (*getin)(in);
            if ((int)uVar3 < 0) {
              uVar2 = 0xffffffff;
              break;
            }
            uVar2 = uVar2 << 7 | uVar3 & 0x7f;
          } while ((char)uVar3 < '\0');
          ptr->height = uVar2;
          if (((uVar2 != 0xffffffff) && (iVar1 = overflow2(4,ptr->width), iVar1 == 0)) &&
             (iVar1 = overflow2(ptr->width << 2,ptr->height), iVar1 == 0)) {
            piVar4 = (int *)gdMalloc((long)ptr->height * (long)ptr->width * 4);
            ptr->bitmap = piVar4;
            if (piVar4 != (int *)0x0) {
              if (0 < ptr->height) {
                iVar6 = 0;
                iVar1 = 0;
                do {
                  if (0 < ptr->width) {
                    iVar7 = 0;
                    do {
                      uVar2 = (*getin)(in);
                      uVar3 = 7;
                      iVar5 = iVar7;
                      do {
                        if (iVar5 < ptr->width) {
                          ptr->bitmap[iVar6] = (uint)((uVar2 >> (uVar3 & 0x1f) & 1) != 0);
                          iVar6 = iVar6 + 1;
                        }
                        iVar5 = iVar5 + 1;
                        bVar8 = uVar3 != 0;
                        uVar3 = uVar3 - 1;
                      } while (bVar8);
                      iVar7 = iVar7 + 8;
                    } while (iVar7 < ptr->width);
                  }
                  iVar1 = iVar1 + 1;
                } while (iVar1 < ptr->height);
              }
              *return_wbmp = ptr;
              return 0;
            }
          }
        }
        gdFree(ptr);
        return -1;
      }
    }
    gdFree(ptr);
  }
  return -1;
}

Assistant:

int readwbmp(int (*getin) (void *in), void *in, Wbmp **return_wbmp)
{
	int row, col, byte, pel, pos;
	Wbmp *wbmp;

	if((wbmp = (Wbmp *)gdMalloc(sizeof(Wbmp))) == NULL) {
		return -1;
	}

	wbmp->type = getin(in);
	if(wbmp->type != 0) {
		gdFree(wbmp);
		return -1;
	}

	if(skipheader(getin, in)) {
		gdFree(wbmp);
		return -1;
	}

	wbmp->width = getmbi(getin, in);
	if(wbmp->width == -1) {
		gdFree(wbmp);
		return -1;
	}

	wbmp->height = getmbi(getin, in);
	if(wbmp->height == -1) {
		gdFree(wbmp);
		return -1;
	}

#ifdef __DEBUG
	printf("W: %d, H: %d\n", wbmp->width, wbmp->height);
#endif

	if(	overflow2(sizeof(int), wbmp->width) ||
		overflow2(sizeof(int) * wbmp->width, wbmp->height)) {
		gdFree(wbmp);
		return -1;
	}

	if((wbmp->bitmap = (int *)gdMalloc(sizeof(int) * wbmp->width * wbmp->height)) == NULL) {
		gdFree(wbmp);
		return -1;
	}

#ifdef __DEBUG
	printf("DATA CONSTRUCTED\n");
#endif

	pos = 0;
	for(row = 0; row < wbmp->height; row++) {
		for(col = 0; col < wbmp->width;) {
			byte = getin(in);

			for(pel = 7; pel >= 0; pel--) {
				if(col++ < wbmp->width) {
					if(byte & 1 << pel) {
						wbmp->bitmap[pos] = WBMP_WHITE;
					} else {
						wbmp->bitmap[pos] = WBMP_BLACK;
					}
					pos++;
				}
			}
		}
	}

	*return_wbmp = wbmp;

	return 0;
}